

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O2

IOTHUB_MESSAGE_HANDLE IoTHubMessage_CreateFromByteArray(uchar *byteArray,size_t size)

{
  LOGGER_LOG p_Var1;
  IOTHUB_MESSAGE_HANDLE_DATA *handleData;
  BUFFER_HANDLE pBVar2;
  MAP_HANDLE pMVar3;
  int iVar4;
  char *pcVar5;
  uchar temp;
  
  if (size != 0 && byteArray == (uchar *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return (IOTHUB_MESSAGE_HANDLE)0x0;
    }
    pcVar5 = "Invalid argument - byteArray is NULL";
    iVar4 = 0xe8;
LAB_00123a12:
    (*p_Var1)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
              ,"IoTHubMessage_CreateFromByteArray",iVar4,1,pcVar5);
    return (IOTHUB_MESSAGE_HANDLE)0x0;
  }
  handleData = (IOTHUB_MESSAGE_HANDLE_DATA *)calloc(1,0x90);
  if (handleData == (IOTHUB_MESSAGE_HANDLE_DATA *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return (IOTHUB_MESSAGE_HANDLE)0x0;
    }
    pcVar5 = "unable to malloc";
    iVar4 = 0xf0;
    goto LAB_00123a12;
  }
  temp = '\0';
  if (size == 0) {
    byteArray = &temp;
  }
  pBVar2 = BUFFER_create(byteArray,size);
  (handleData->value).byteArray = pBVar2;
  if (pBVar2 == (BUFFER_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) goto LAB_00123a4b;
    pcVar5 = "BUFFER_create failed";
    iVar4 = 0x111;
  }
  else {
    pMVar3 = Map_Create(ValidateAsciiCharactersFilter);
    handleData->properties = pMVar3;
    if (pMVar3 != (MAP_HANDLE)0x0) {
      return handleData;
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) goto LAB_00123a4b;
    pcVar5 = "Map_Create for properties failed";
    iVar4 = 0x117;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
            ,"IoTHubMessage_CreateFromByteArray",iVar4,1,pcVar5);
LAB_00123a4b:
  DestroyMessageData(handleData);
  return (IOTHUB_MESSAGE_HANDLE)0x0;
}

Assistant:

IOTHUB_MESSAGE_HANDLE IoTHubMessage_CreateFromByteArray(const unsigned char* byteArray, size_t size)
{
    IOTHUB_MESSAGE_HANDLE_DATA* result;
    if ((byteArray == NULL) && (size != 0))
    {
        LogError("Invalid argument - byteArray is NULL");
        result = NULL;
    }
    else
    {
        result = (IOTHUB_MESSAGE_HANDLE_DATA*)malloc(sizeof(IOTHUB_MESSAGE_HANDLE_DATA));
        if (result == NULL)
        {
            LogError("unable to malloc");
            /*let it go through*/
        }
        else
        {
            const unsigned char* source;
            unsigned char temp = 0x00;

            memset(result, 0, sizeof(*result));
            result->contentType = IOTHUBMESSAGE_BYTEARRAY;

            if (size != 0)
            {
                if (byteArray == NULL)
                {
                    LogError("Attempted to create a Hub Message from a NULL pointer!");
                    DestroyMessageData(result);
                    result = NULL;
                    source = NULL;
                }
                else
                {
                    source = byteArray;
                }
            }
            else
            {
                source = &temp;
            }
            if (result != NULL)
            {
                if ((result->value.byteArray = BUFFER_create(source, size)) == NULL)
                {
                    LogError("BUFFER_create failed");
                    DestroyMessageData(result);
                    result = NULL;
                }
                else if ((result->properties = Map_Create(ValidateAsciiCharactersFilter)) == NULL)
                {
                    LogError("Map_Create for properties failed");
                    DestroyMessageData(result);
                    result = NULL;
                }
            }
        }
    }
    return result;
}